

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_ERROR sinc_stereo_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SINC_FILTER *filter;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int ch;
  SRC_ERROR SVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double local_88 [5];
  double local_60;
  SRC_STATE *local_58;
  SRC_DATA *local_50;
  undefined1 local_48 [16];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar11 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar16 = state->channels;
    filter->in_count = data->input_frames * (long)iVar16;
    filter->out_count = data->output_frames * (long)iVar16;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar26 = state->last_ratio;
    SVar11 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar26) && (dVar26 <= 256.0)) {
      dVar23 = dVar26;
      if (data->src_ratio <= dVar26) {
        dVar23 = data->src_ratio;
      }
      dVar25 = state->last_position;
      dVar27 = dVar25 - (double)(int)ROUND(dVar25);
      dVar27 = (double)(~-(ulong)(dVar27 < 0.0) & (ulong)dVar27 |
                       (ulong)(dVar27 + 1.0) & -(ulong)(dVar27 < 0.0));
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar27;
      filter->b_current = ((int)ROUND(dVar25 - dVar27) * iVar16 + filter->b_current) % filter->b_len
      ;
      if (filter->out_gen < filter->out_count) {
        dVar25 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        iVar16 = ((int)ROUND((double)(-(ulong)(dVar23 < 1.0) & (ulong)(dVar25 / dVar23) |
                                     ~-(ulong)(dVar23 < 1.0) & (ulong)dVar25)) + 1) * iVar16;
        local_88[4] = 1.0 / dVar26 + 1e-20;
        local_58 = state;
        local_50 = data;
        do {
          data = local_50;
          state = local_58;
          if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar16) {
            local_60 = dVar26;
            local_48 = auVar28;
            SVar11 = prepare_data(filter,local_58->channels,local_50,iVar16);
            state->error = SVar11;
            if (SVar11 != SRC_ERR_NO_ERROR) {
              return SVar11;
            }
            dVar27 = local_48._0_8_;
            dVar26 = local_60;
            auVar28 = local_48;
            if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar16)
            break;
          }
          dVar27 = auVar28._0_8_;
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <= (double)filter->b_current + dVar27 + local_88[4]))
          break;
          if (0 < filter->out_count) {
            dVar23 = state->last_ratio;
            if (1e-10 < ABS(dVar23 - data->src_ratio)) {
              dVar26 = ((data->src_ratio - dVar23) * (double)filter->out_gen) /
                       (double)filter->out_count + dVar23;
            }
          }
          iVar3 = filter->index_inc;
          dVar23 = dVar26;
          if (1.0 <= dVar26) {
            dVar23 = 1.0;
          }
          dVar23 = dVar23 * (double)iVar3;
          uVar19 = (uint)ROUND(dVar23 * 4096.0);
          iVar20 = (int)ROUND(dVar27 * dVar23 * 4096.0);
          iVar4 = state->channels;
          lVar17 = filter->out_gen;
          pfVar7 = data->data_out;
          iVar5 = filter->coeff_half_len;
          iVar6 = filter->b_current;
          iVar12 = (iVar5 * 0x1000 - iVar20) / (int)uVar19;
          uVar21 = iVar12 * uVar19 + iVar20;
          uVar18 = iVar6 - iVar12 * iVar4;
          if ((int)uVar18 < 0) {
            if (((int)uVar19 < 1) || ((int)uVar21 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar15 = 1 - uVar18 >> 1;
            if (((uVar19 + uVar21) - 1) / uVar19 < uVar15) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x21d,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            uVar21 = uVar21 - uVar15 * uVar19;
            uVar18 = uVar18 + (1 - uVar18 & 0xfffffffe);
          }
          local_88[2] = 0.0;
          local_88[3] = 0.0;
          if (-1 < (int)uVar21) {
            uVar13 = (ulong)uVar18;
            lVar14 = uVar13 * 4;
            do {
              uVar15 = uVar21 >> 0xc;
              if (iVar5 < (int)uVar15) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x225,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (((int)uVar18 < 0) || (iVar12 = (int)uVar13 + 1, filter->b_len <= iVar12)) {
                __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x227,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              if (filter->b_end <= iVar12) {
                __assert_fail("data_index + 1 < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x228,
                              "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                             );
              }
              fVar1 = filter->coeffs[uVar15];
              fVar2 = filter->coeffs[(ulong)uVar15 + 1];
              pfVar8 = filter->buffer;
              lVar22 = 0;
              do {
                local_88[lVar22 + 2] =
                     (double)*(float *)((long)pfVar8 + lVar22 * 4 + lVar14) *
                     ((double)(uVar21 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                     (double)fVar1) + local_88[lVar22 + 2];
                lVar22 = lVar22 + 1;
              } while (lVar22 == 1);
              uVar13 = uVar13 + 2;
              lVar14 = lVar14 + 8;
              uVar21 = uVar21 - uVar19;
            } while (-1 < (int)uVar21);
          }
          iVar12 = (int)(iVar5 * 0x1000 - (uVar19 - iVar20)) / (int)uVar19;
          uVar21 = (iVar12 + 1) * iVar4 + iVar6;
          local_88[0] = 0.0;
          local_88[1] = 0.0;
          uVar18 = iVar12 * uVar19 + (uVar19 - iVar20);
          do {
            uVar15 = (int)uVar18 >> 0xc;
            if (((int)uVar15 < 0) || (iVar5 < (int)uVar15)) {
              __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23a,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            if ((int)uVar21 < 0) {
LAB_00104135:
              __assert_fail("data_index >= 0 && data_index + 1 < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23c,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            iVar12 = filter->b_len;
            if (iVar12 <= (int)(uVar21 + 1)) goto LAB_00104135;
            if (filter->b_end <= (int)(uVar21 + 1)) {
              __assert_fail("data_index + 1 < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x23d,
                            "void calc_output_stereo(SINC_FILTER *, int, increment_t, increment_t, double, float *)"
                           );
            }
            fVar1 = filter->coeffs[uVar15];
            fVar2 = filter->coeffs[(ulong)uVar15 + 1];
            pfVar8 = filter->buffer;
            lVar14 = 0;
            do {
              local_88[lVar14] =
                   (double)pfVar8[(ulong)uVar21 + lVar14] *
                   ((double)(uVar18 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                   (double)fVar1) + local_88[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 == 1);
            uVar21 = uVar21 - 2;
            uVar15 = uVar18 - uVar19;
            bVar9 = (int)uVar19 <= (int)uVar18;
            uVar18 = uVar15;
          } while (uVar15 != 0 && bVar9);
          lVar14 = 0;
          do {
            pfVar7[lVar17 + lVar14] =
                 (float)((local_88[lVar14 + 2] + local_88[lVar14]) * (dVar23 / (double)iVar3));
            lVar14 = lVar14 + 1;
          } while (lVar14 == 1);
          lVar17 = lVar17 + 2;
          filter->out_gen = lVar17;
          dVar25 = dVar27 + 1.0 / dVar26;
          dVar23 = dVar25 - (double)(int)ROUND(dVar25);
          auVar24._0_8_ = ~-(ulong)(dVar23 < 0.0) & (ulong)dVar23;
          auVar24._8_8_ = 0;
          auVar10._8_4_ = auVar28._8_4_;
          auVar10._0_8_ = (ulong)(dVar23 + 1.0) & -(ulong)(dVar23 < 0.0);
          auVar10._12_4_ = auVar28._12_4_;
          auVar28 = auVar24 | auVar10;
          dVar27 = auVar28._0_8_;
          filter->b_current = ((int)ROUND(dVar25 - dVar27) * iVar4 + iVar6) % iVar12;
          data = local_50;
          state = local_58;
        } while (lVar17 < filter->out_count);
      }
      state->last_position = dVar27;
      state->last_ratio = dVar26;
      iVar16 = state->channels;
      data->input_frames_used = filter->in_used / (long)iVar16;
      data->output_frames_gen = filter->out_gen / (long)iVar16;
      SVar11 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar11;
}

Assistant:

SRC_ERROR
sinc_stereo_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_stereo (filter, state->channels, increment, start_filter_index, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += 2 ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}